

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O3

FaceData * __thiscall Ptex::v2_4::PtexReader::errorData(PtexReader *this,bool deleteOnRelease)

{
  int iVar1;
  pointer __src;
  FaceData *pFVar2;
  _func_int **__dest;
  
  pFVar2 = (FaceData *)operator_new(0x20);
  __src = (this->_errorPixel).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar1 = this->_pixelsize;
  (pFVar2->_res).ulog2 = '\0';
  (pFVar2->_res).vlog2 = '\0';
  (pFVar2->super_PtexFaceData)._vptr_PtexFaceData = (_func_int **)&PTR__PackedFace_0011d600;
  *(int *)&pFVar2->field_0xc = iVar1;
  __dest = (_func_int **)operator_new__((long)iVar1);
  pFVar2[1].super_PtexFaceData._vptr_PtexFaceData = __dest;
  (pFVar2->super_PtexFaceData)._vptr_PtexFaceData = (_func_int **)&PTR__PackedFace_0011da88;
  pFVar2[1]._res.ulog2 = deleteOnRelease;
  memcpy(__dest,__src,(long)iVar1);
  return pFVar2;
}

Assistant:

FaceData* errorData(bool deleteOnRelease=false)
    {
        return new ErrorFace(&_errorPixel[0], _pixelsize, deleteOnRelease);
    }